

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O1

size_t dicroce::blob_tree::_write_treeb(blob_tree *rt,uint8_t *p,uint8_t *end)

{
  uint8_t *__dest;
  pointer pbVar1;
  ushort uVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ushort *puVar8;
  blob_tree *c;
  pointer rt_00;
  
  if ((ulong)((long)end - (long)p) < 5) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
  }
  else {
    sVar3 = (rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    bVar5 = ((rt->_childrenByIndex).
             super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
             super__Vector_impl_data._M_start ==
            (rt->_childrenByIndex).
            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl.
            super__Vector_impl_data._M_finish) + 1;
    if (sVar3 != 0) {
      bVar5 = 0;
    }
    *p = bVar5;
    if (bVar5 < 2) {
      if (sVar3 == 0) {
        uVar6 = (int)((long)(rt->_childrenByIndex).
                            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(rt->_childrenByIndex).
                            super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x45d1745d;
      }
      else {
        uVar6 = (uint)(rt->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      puVar8 = (ushort *)(p + 5);
      *(uint *)(p + 1) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      if (sVar3 == 0) {
        pbVar1 = (rt->_childrenByIndex).
                 super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (rt_00 = (rt->_childrenByIndex).
                     super__Vector_base<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>.
                     _M_impl.super__Vector_impl_data._M_start; rt_00 != pbVar1; rt_00 = rt_00 + 1) {
          sVar3 = _write_treeb(rt_00,(uint8_t *)puVar8,end);
          puVar8 = (ushort *)((long)puVar8 + sVar3);
        }
      }
      else {
        for (p_Var4 = (rt->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &(rt->_children)._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          if ((ulong)((long)end - (long)puVar8) < 2) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
            goto LAB_001046e4;
          }
          uVar7 = (ulong)p_Var4[1]._M_parent & 0xffff;
          uVar2 = (ushort)p_Var4[1]._M_parent;
          *puVar8 = uVar2 << 8 | uVar2 >> 8;
          puVar8 = puVar8 + 1;
          if ((ulong)((long)end - (long)puVar8) < uVar7) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
            goto LAB_001046e4;
          }
          memcpy(puVar8,*(void **)(p_Var4 + 1),uVar7);
          sVar3 = _write_treeb((blob_tree *)(p_Var4 + 2),(uint8_t *)((long)puVar8 + uVar7),end);
          puVar8 = (ushort *)((uint8_t *)((long)puVar8 + uVar7) + sVar3);
        }
      }
LAB_00104671:
      return (long)puVar8 - (long)p;
    }
    if ((ulong)((long)end - (long)(p + 1)) < 4) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
    }
    else {
      uVar7 = (rt->_payload).first;
      uVar6 = (uint)uVar7;
      uVar7 = uVar7 & 0xffffffff;
      *(uint *)(p + 1) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      __dest = p + 5;
      if (uVar7 <= (ulong)((long)end - (long)__dest)) {
        memcpy(__dest,(rt->_payload).second,uVar7);
        puVar8 = (ushort *)(__dest + uVar7);
        goto LAB_00104671;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Buffer too small to serialize blob_tree.");
    }
  }
LAB_001046e4:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline static size_t _bytes_left(const uint8_t* p, const uint8_t* end) { return end - p; }